

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O3

void __thiscall
mp::pre::Many2ManyLink::PostsolveGenericInt
          (Many2ManyLink *this,LinkIndexRange ir,ValueResolution vr)

{
  _Elt_pointer ppVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pair<mp::pre::NodeRange,_mp::pre::NodeRange> *ppVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  if (ir.end_ != ir.beg_) {
    uVar9 = (long)ir >> 0x20;
    lVar8 = uVar9 << 5;
    uVar7 = uVar9;
    do {
      uVar7 = uVar7 - 1;
      uVar9 = uVar9 - 1;
      iVar3 = (int)uVar7;
      if (vr == ValResAll) {
LAB_0015d5b5:
        ppVar1 = (this->entries_).
                 super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar4 = ((long)ppVar1 -
                 (long)(this->entries_).
                       super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + uVar7;
        if ((long)uVar4 < 0) {
          uVar6 = (long)uVar4 >> 4;
LAB_0015d5eb:
          ppVar5 = (this->entries_).
                   super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] + uVar4 + uVar6 * -0x10;
        }
        else {
          if (0xf < uVar4) {
            uVar6 = uVar4 >> 4;
            goto LAB_0015d5eb;
          }
          ppVar5 = (pair<mp::pre::NodeRange,_mp::pre::NodeRange> *)
                   ((long)&ppVar1[-1].first.pvn_ + lVar8);
        }
        Collect<int>(this,ppVar5->first,ppVar5->second,vr);
      }
      else {
        iVar2 = iVar3 + 0x3f;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        if (((this->if_consider_for_last_link_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [(long)(iVar2 >> 6) +
              (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar7 & 0x3f) & 1) != 0) goto LAB_0015d5b5;
        iVar3 = (int)uVar9;
      }
      lVar8 = lVar8 + -0x20;
    } while (iVar3 != ir.beg_);
  }
  return;
}

Assistant:

LIST_PRESOLVE_METHODS

protected:
  /// Distribute values of type T from nr1 to nr2
  template <class T>
  void Distr(NodeRange nr1, NodeRange nr2, ValueResolution vr) {
    auto ir1 = nr1.GetIndexRange();
    auto ir2 = nr2.GetIndexRange();
    for (auto i0=ir1.beg_; i0!=ir1.end_; ++i0) {
      // Need reference here for reference counting
      // in PresolveNames():
      const auto& val = nr1.GetValueNode()->
          GetVal<T>(i0);
      if (ValueResolution::ValResAll == vr) {
        for (auto i=ir2.beg_; i!=ir2.end_; ++i)
          nr2.GetValueNode()->SetVal(i, val);
      } else {
        assert(ValueResolution::ValResLast == vr);
        nr2.GetValueNode()->SetVal(ir2.end_ - 1, val);
      }
    }